

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode
UA_Subscription_deleteMonitoredItem
          (UA_Server *server,UA_Subscription *sub,UA_UInt32 monitoredItemID)

{
  UA_MonitoredItem *pUVar1;
  UA_MonitoredItem *monitoredItem;
  
  monitoredItem = (UA_MonitoredItem *)&sub->monitoredItems;
  do {
    monitoredItem = (monitoredItem->listEntry).le_next;
    if (monitoredItem == (UA_MonitoredItem *)0x0) {
      return 0x80420000;
    }
  } while (monitoredItem->itemId != monitoredItemID);
  pUVar1 = (monitoredItem->listEntry).le_next;
  if (pUVar1 != (UA_MonitoredItem *)0x0) {
    (pUVar1->listEntry).le_prev = (monitoredItem->listEntry).le_prev;
  }
  *(monitoredItem->listEntry).le_prev = pUVar1;
  MonitoredItem_delete(server,monitoredItem);
  return 0;
}

Assistant:

UA_StatusCode
UA_Subscription_deleteMonitoredItem(UA_Server *server, UA_Subscription *sub,
                                    UA_UInt32 monitoredItemID) {
    UA_MonitoredItem *mon;
    LIST_FOREACH(mon, &sub->monitoredItems, listEntry) {
        if(mon->itemId == monitoredItemID) {
            LIST_REMOVE(mon, listEntry);
            MonitoredItem_delete(server, mon);
            return UA_STATUSCODE_GOOD;
        }
    }
    return UA_STATUSCODE_BADMONITOREDITEMIDINVALID;
}